

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

bool __thiscall google::protobuf::Symbol::is_placeholder(Symbol *this)

{
  Type TVar1;
  Descriptor *this_00;
  EnumDescriptor *this_01;
  FileDescriptor *this_02;
  Symbol *this_local;
  
  TVar1 = type(this);
  if (TVar1 == MESSAGE) {
    this_00 = descriptor(this);
    this_local._7_1_ = Descriptor::is_placeholder(this_00);
  }
  else if (TVar1 == ENUM) {
    this_01 = enum_descriptor(this);
    this_local._7_1_ = EnumDescriptor::is_placeholder(this_01);
  }
  else if (TVar1 == FULL_PACKAGE) {
    this_02 = file_descriptor(this);
    this_local._7_1_ = FileDescriptor::is_placeholder(this_02);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool is_placeholder() const {
    switch (type()) {
      case MESSAGE:
        return descriptor()->is_placeholder();
      case ENUM:
        return enum_descriptor()->is_placeholder();
      case FULL_PACKAGE:
        return file_descriptor()->is_placeholder();
      default:
        return false;
    }
  }